

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshManipulator.cpp
# Opt level: O2

vector3df irr::scene::getAngleWeight(vector3df *v1,vector3df *v2,vector3df *v3)

{
  float fVar1;
  float fVar2;
  float __x;
  float fVar3;
  float __x_00;
  float fVar4;
  vector3df vVar5;
  
  fVar1 = core::vector3d<float>::getDistanceFromSQ(v2,v3);
  if (fVar1 < 0.0) {
    fVar2 = sqrtf(fVar1);
  }
  else {
    fVar2 = SQRT(fVar1);
  }
  __x = core::vector3d<float>::getDistanceFromSQ(v1,v3);
  if (__x < 0.0) {
    fVar3 = sqrtf(__x);
  }
  else {
    fVar3 = SQRT(__x);
  }
  __x_00 = core::vector3d<float>::getDistanceFromSQ(v1,v2);
  if (__x_00 < 0.0) {
    fVar4 = sqrtf(__x_00);
  }
  else {
    fVar4 = SQRT(__x_00);
  }
  vVar5.X = acosf(((__x + __x_00) - fVar1) / ((fVar3 + fVar3) * fVar4));
  fVar4 = acosf(((__x_00 - __x) + fVar1) / ((fVar2 + fVar2) * fVar4));
  fVar1 = acosf(((__x - __x_00) + fVar1) / ((fVar3 + fVar3) * fVar2));
  vVar5.Y = fVar4;
  vVar5.Z = fVar1;
  return vVar5;
}

Assistant:

static inline core::vector3df getAngleWeight(const core::vector3df &v1,
		const core::vector3df &v2,
		const core::vector3df &v3)
{
	// Calculate this triangle's weight for each of its three vertices
	// start by calculating the lengths of its sides
	const f32 a = v2.getDistanceFromSQ(v3);
	const f32 asqrt = sqrtf(a);
	const f32 b = v1.getDistanceFromSQ(v3);
	const f32 bsqrt = sqrtf(b);
	const f32 c = v1.getDistanceFromSQ(v2);
	const f32 csqrt = sqrtf(c);

	// use them to find the angle at each vertex
	return core::vector3df(
			acosf((b + c - a) / (2.f * bsqrt * csqrt)),
			acosf((-b + c + a) / (2.f * asqrt * csqrt)),
			acosf((b - c + a) / (2.f * bsqrt * asqrt)));
}